

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_node_action * lysp_node_actions(lysp_node *node)

{
  lysp_node_action **pplVar1;
  lysp_node_action **actions;
  lysp_node *node_local;
  
  pplVar1 = lysp_node_actions_p(node);
  if (pplVar1 == (lysp_node_action **)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    node_local = (lysp_node *)*pplVar1;
  }
  return (lysp_node_action *)node_local;
}

Assistant:

lysp_node_action *
lysp_node_actions(const struct lysp_node *node)
{
    struct lysp_node_action **actions;

    actions = lysp_node_actions_p((struct lysp_node *)node);
    if (actions) {
        return *actions;
    } else {
        return NULL;
    }
}